

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::SuggestFieldNumbers
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  char *pcVar1;
  long lVar2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  pointer pRVar3;
  pointer pRVar4;
  bool bVar5;
  pointer prVar6;
  FieldDescriptor *pFVar7;
  ReservedRange *pRVar8;
  ExtensionRange *pEVar9;
  ulong uVar10;
  __normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_> __i;
  long lVar11;
  pointer pRVar12;
  int i;
  int iVar13;
  long lVar14;
  string_view element_name;
  Descriptor *message;
  int current_ordinal;
  int fields_to_suggest;
  vector<Range,_std::allocator<Range>_> used_ordinals;
  anon_class_32_4_93375ba9 make_error;
  anon_class_8_1_e1c71c84 add_range;
  anon_class_8_1_e1c71c84 add_ordinal;
  iterator hints_it;
  
  for (lVar14 = 0; lVar14 < file->message_type_count_; lVar14 = lVar14 + 1) {
    message = file->message_types_ + lVar14;
    hints_it = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
               ::find<google::protobuf::Descriptor_const*>
                         ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                           *)&this->message_hints_,&message);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                *)&this->message_hints_);
    make_error.message = (Descriptor **)0x0;
    bVar5 = absl::lts_20250127::container_internal::operator==(&hints_it,(iterator *)&make_error);
    if (!bVar5) {
      prVar6 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
               ::iterator::operator->(&hints_it);
      iVar13 = (prVar6->second).fields_to_suggest;
      fields_to_suggest = 3;
      if (iVar13 < 3) {
        fields_to_suggest = iVar13;
      }
      if (0 < iVar13) {
        used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        add_range.used_ordinals = &used_ordinals;
        add_ordinal.used_ordinals = add_range.used_ordinals;
        for (iVar13 = 0; iVar13 < message->field_count_; iVar13 = iVar13 + 1) {
          pFVar7 = Descriptor::field(message,iVar13);
          SuggestFieldNumbers::anon_class_8_1_e1c71c84::operator()(&add_ordinal,pFVar7->number_);
        }
        for (iVar13 = 0; iVar13 < message->extension_count_; iVar13 = iVar13 + 1) {
          pFVar7 = Descriptor::extension(message,iVar13);
          SuggestFieldNumbers::anon_class_8_1_e1c71c84::operator()(&add_ordinal,pFVar7->number_);
        }
        for (iVar13 = 0; iVar13 < message->reserved_range_count_; iVar13 = iVar13 + 1) {
          pRVar8 = Descriptor::reserved_range(message,iVar13);
          SuggestFieldNumbers::anon_class_8_1_e1c71c84::operator()
                    (&add_range,pRVar8->start,pRVar8->end);
        }
        for (iVar13 = 0; iVar13 < message->extension_range_count_; iVar13 = iVar13 + 1) {
          pEVar9 = Descriptor::extension_range(message,iVar13);
          SuggestFieldNumbers::anon_class_8_1_e1c71c84::operator()
                    (&add_range,pEVar9->start_,pEVar9->end_);
        }
        make_error.message = (Descriptor **)0x200000001fffffff;
        std::vector<Range,_std::allocator<Range>_>::push_back
                  (&used_ordinals,(value_type *)&make_error);
        make_error.message = (Descriptor **)0x4e1f00004a38;
        std::vector<Range,_std::allocator<Range>_>::push_back
                  (&used_ordinals,(value_type *)&make_error);
        pRVar4 = used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pRVar3 = used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
            super__Vector_impl_data._M_start !=
            used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          lVar11 = (long)used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                         super__Vector_impl_data._M_start;
          uVar10 = lVar11 >> 3;
          lVar2 = 0x3f;
          if (uVar10 != 0) {
            for (; uVar10 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range*,std::vector<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range,std::allocator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__3>>
                    (used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                     super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar11 < 0x81) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range*,std::vector<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range,std::allocator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__3>>
                      (pRVar3,pRVar4);
          }
          else {
            pRVar12 = pRVar3 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range*,std::vector<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range,std::allocator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__3>>
                      (pRVar3,pRVar12);
            for (; pRVar12 != pRVar4; pRVar12 = pRVar12 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range*,std::vector<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range,std::allocator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__3>>
                        (pRVar12);
            }
          }
        }
        current_ordinal = 1;
        if ((prVar6->second).first_reason != (Message *)0x0) {
          make_error.message = &message;
          make_error.used_ordinals = &used_ordinals;
          make_error.current_ordinal = &current_ordinal;
          make_error.fields_to_suggest = &fields_to_suggest;
          pcVar1 = (message->all_names_).payload_;
          element_name._M_len = (ulong)*(ushort *)(pcVar1 + 2);
          element_name._M_str = pcVar1 + ~element_name._M_len;
          make_error_00.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          make_error_00.ptr_.obj = &make_error;
          AddError(this,element_name,(prVar6->second).first_reason,
                   (prVar6->second).first_reason_location,make_error_00);
        }
        std::vector<Range,_std::allocator<Range>_>::~vector(&used_ordinals);
      }
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::SuggestFieldNumbers(FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  for (int message_index = 0; message_index < file->message_type_count();
       message_index++) {
    const Descriptor* message = &file->message_types_[message_index];
    auto hints_it = message_hints_.find(message);
    if (hints_it == message_hints_.end()) continue;
    auto* hints = &hints_it->second;
    constexpr int kMaxSuggestions = 3;
    int fields_to_suggest = std::min(kMaxSuggestions, hints->fields_to_suggest);
    if (fields_to_suggest <= 0) continue;
    struct Range {
      int from;
      int to;
    };
    std::vector<Range> used_ordinals;
    auto add_ordinal = [&](int ordinal) {
      if (ordinal <= 0 || ordinal > FieldDescriptor::kMaxNumber) return;
      if (!used_ordinals.empty() && ordinal == used_ordinals.back().to) {
        used_ordinals.back().to = ordinal + 1;
      } else {
        used_ordinals.push_back({ordinal, ordinal + 1});
      }
    };
    auto add_range = [&](int from, int to) {
      from = std::max(0, std::min(FieldDescriptor::kMaxNumber + 1, from));
      to = std::max(0, std::min(FieldDescriptor::kMaxNumber + 1, to));
      if (from >= to) return;
      used_ordinals.push_back({from, to});
    };
    for (int i = 0; i < message->field_count(); i++) {
      add_ordinal(message->field(i)->number());
    }
    for (int i = 0; i < message->extension_count(); i++) {
      add_ordinal(message->extension(i)->number());
    }
    for (int i = 0; i < message->reserved_range_count(); i++) {
      auto range = message->reserved_range(i);
      add_range(range->start, range->end);
    }
    for (int i = 0; i < message->extension_range_count(); i++) {
      auto range = message->extension_range(i);
      add_range(range->start_number(), range->end_number());
    }
    used_ordinals.push_back(
        {FieldDescriptor::kMaxNumber, FieldDescriptor::kMaxNumber + 1});
    used_ordinals.push_back({FieldDescriptor::kFirstReservedNumber,
                             FieldDescriptor::kLastReservedNumber});
    std::sort(used_ordinals.begin(), used_ordinals.end(),
              [](Range lhs, Range rhs) {
                return std::tie(lhs.from, lhs.to) < std::tie(rhs.from, rhs.to);
              });
    int current_ordinal = 1;
    if (hints->first_reason) {
      auto make_error = [&] {
        std::stringstream id_list;
        id_list << "Suggested field numbers for " << message->full_name()
                << ": ";
        const char* separator = "";
        for (auto& current_range : used_ordinals) {
          while (current_ordinal < current_range.from &&
                 fields_to_suggest > 0) {
            id_list << separator << current_ordinal++;
            separator = ", ";
            fields_to_suggest--;
          }
          if (fields_to_suggest == 0) break;
          current_ordinal = std::max(current_ordinal, current_range.to);
        }
        return id_list.str();
      };
      AddError(message->full_name(), *hints->first_reason,
               hints->first_reason_location, make_error);
    }
  }
}